

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall pstd::pmr::monotonic_buffer_resource::release(monotonic_buffer_resource *this)

{
  list<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  *this_00;
  void *pvVar1;
  _List_node_base *p_Var2;
  
  this_00 = &this->usedBlocks;
  p_Var2 = (_List_node_base *)this_00;
  while (p_Var2 = (((_List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
                     *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var2 != (_List_node_base *)this_00) {
    if (p_Var2[1]._M_next != (_List_node_base *)0x0) {
      (*this->upstreamResource->_vptr_memory_resource[3])
                (this->upstreamResource,p_Var2[1]._M_next,p_Var2[1]._M_prev,0x10);
    }
  }
  std::__cxx11::
  list<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  ::clear(this_00);
  pvVar1 = (this->currentBlock).ptr;
  if (pvVar1 != (void *)0x0) {
    (*this->upstreamResource->_vptr_memory_resource[3])
              (this->upstreamResource,pvVar1,(this->currentBlock).size,0x10);
  }
  (this->currentBlock).ptr = (void *)0x0;
  (this->currentBlock).size = 0;
  return;
}

Assistant:

void release() {
        for (const auto &block : usedBlocks)
            upstreamResource->deallocate(block.ptr, block.size);
        usedBlocks.clear();

        upstreamResource->deallocate(currentBlock.ptr, currentBlock.size);
        currentBlock = MemoryBlock();
    }